

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,NumericForStatement *num_for,void *data)

{
  int line;
  Function *this_00;
  SyntaxTree *pSVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  ExpVarData_conflict name_exp_data;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  Guard l;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  Guard g;
  
  l.leave_.super__Function_base._M_functor._8_8_ = 0;
  l.leave_._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:869:9)>
       ::_M_invoke;
  l.leave_.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:869:9)>
       ::_M_manager;
  name_exp_data = (ExpVarData_conflict)this;
  l.leave_.super__Function_base._M_functor._M_unused._M_object = this;
  Guard::Guard(&g,&l.leave_,(function<void_()> *)&name_exp_data);
  std::_Function_base::~_Function_base((_Function_base *)&name_exp_data);
  std::_Function_base::~_Function_base((_Function_base *)&l);
  uVar2 = GenerateRegisterId(this);
  uVar3 = GenerateRegisterId(this);
  uVar4 = GenerateRegisterId(this);
  this_00 = this->current_function_->function_;
  line = (num_for->name_).line_;
  name_exp_data.start_register_ = 0;
  name_exp_data.end_register_ = 0;
  local_b8._12_4_ = 0;
  local_b8._8_4_ = this->current_function_->register_id_;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:879:13)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:879:13)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  Guard::Guard(&l,(function<void_()> *)&name_exp_data,(function<void_()> *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&name_exp_data);
  name_exp_data.end_register_ = uVar2 + 1;
  name_exp_data.start_register_ = uVar2;
  pSVar1 = (num_for->exp1_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&name_exp_data);
  Guard::~Guard(&l);
  name_exp_data.start_register_ = 0;
  name_exp_data.end_register_ = 0;
  local_b8._12_4_ = 0;
  local_b8._8_4_ = this->current_function_->register_id_;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:884:13)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:884:13)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  Guard::Guard(&l,(function<void_()> *)&name_exp_data,(function<void_()> *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&name_exp_data);
  name_exp_data.end_register_ = uVar3 + 1;
  name_exp_data.start_register_ = uVar3;
  pSVar1 = (num_for->exp2_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&name_exp_data);
  Guard::~Guard(&l);
  name_exp_data.start_register_ = 0;
  name_exp_data.end_register_ = 0;
  local_b8._12_4_ = 0;
  local_b8._8_4_ = this->current_function_->register_id_;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:889:13)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:889:13)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  Guard::Guard(&l,(function<void_()> *)&name_exp_data,(function<void_()> *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&name_exp_data);
  pSVar1 = (num_for->exp3_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 == (SyntaxTree *)0x0) {
    Function::AddInstruction(this_00,(Instruction)((uVar4 & 0xff) << 0x10 | 0x4000000),line);
    Function::AddInstruction(this_00,(Instruction)0x1,line);
  }
  else {
    name_exp_data.end_register_ = uVar4 + 1;
    name_exp_data.start_register_ = uVar4;
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  }
  Guard::~Guard(&l);
  uVar6 = (uVar2 & 0xff) << 0x10;
  uVar4 = uVar4 & 0xff;
  uVar3 = (uVar3 & 0xff) << 8 | uVar6;
  Function::AddInstruction(this_00,(Instruction)(uVar4 + uVar3 + 0x26000000),line);
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:911:9)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:911:9)>
             ::_M_manager;
  name_exp_data = (ExpVarData_conflict)this;
  local_b8._M_unused._M_object = this;
  Guard::Guard(&l,(function<void_()> *)&name_exp_data,(function<void_()> *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&name_exp_data);
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_manager;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:913:13)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  local_70._M_unused._M_object = this;
  Guard::Guard((Guard *)&name_exp_data,(function<void_()> *)&local_b8,(function<void_()> *)&local_70
              );
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  Function::AddInstruction(this_00,(Instruction)(uVar3 + uVar4 | 0x27000000),line);
  sVar5 = Function::AddInstruction(this_00,(Instruction)0x0,line);
  AddLoopJumpInfo(this,&num_for->super_SyntaxTree,(int)sVar5,JumpTail);
  uVar3 = GenerateRegisterId(this);
  InsertName(this,(num_for->name_).field_0.str_,uVar3);
  uVar2 = (uVar2 & 0xff) * 0x100;
  Function::AddInstruction(this_00,(Instruction)((uVar3 & 0xff) * 0x10000 + uVar2 + 0x6000000),line)
  ;
  pSVar1 = (num_for->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  Function::AddInstruction(this_00,(Instruction)(uVar4 + (uVar2 | uVar6) + 0x16000000),line);
  Guard::~Guard((Guard *)&name_exp_data);
  sVar5 = Function::AddInstruction(this_00,(Instruction)0x12000000,line);
  AddLoopJumpInfo(this,&num_for->super_SyntaxTree,(int)sVar5,JumpHead);
  Guard::~Guard(&l);
  Guard::~Guard(&g);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(NumericForStatement *num_for, void *data)
    {
        CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

        auto var_register = GenerateRegisterId();
        auto limit_register = GenerateRegisterId();
        auto step_register = GenerateRegisterId();
        auto function = GetCurrentFunction();
        auto line = num_for->name_.line_;

        // Init name, limit, step
        {
            REGISTER_GENERATOR_GUARD();
            ExpVarData name_exp_data{ var_register, var_register + 1 };
            num_for->exp1_->Accept(this, &name_exp_data);
        }
        {
            REGISTER_GENERATOR_GUARD();
            ExpVarData limit_exp_data{ limit_register, limit_register + 1 };
            num_for->exp2_->Accept(this, &limit_exp_data);
        }
        {
            REGISTER_GENERATOR_GUARD();
            if (num_for->exp3_)
            {
                ExpVarData step_exp_data{ step_register, step_register + 1 };
                num_for->exp3_->Accept(this, &step_exp_data);
            }
            else
            {
                // Default step is 1
                auto instruction = Instruction::ACode(OpType_LoadInt, step_register);
                function->AddInstruction(instruction, line);
                // Int value 1
                instruction.opcode_ = 1;
                function->AddInstruction(instruction, line);
            }
        }

        // Init 'for' var, limit, step value
        auto instruction = Instruction::ABCCode(OpType_ForInit, var_register,
                                                limit_register, step_register);
        function->AddInstruction(instruction, line);

        LOOP_GUARD(num_for);
        {
            CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);

            // Check 'for', continue loop or not
            instruction = Instruction::ABCCode(OpType_ForStep, var_register,
                limit_register, step_register);
            function->AddInstruction(instruction, line);

            // Break loop, prepare to jump to the end of the loop
            instruction.opcode_ = 0;
            int index = function->AddInstruction(instruction, line);
            AddLoopJumpInfo(num_for, index, LoopJumpInfo::JumpTail);

            auto name_register = GenerateRegisterId();
            InsertName(num_for->name_.str_, name_register);

            // Prepare name value
            instruction = Instruction::ABCode(OpType_Move, name_register, var_register);
            function->AddInstruction(instruction, line);

            num_for->block_->Accept(this, nullptr);

            // var = var + step
            instruction = Instruction::ABCCode(OpType_Add, var_register,
                var_register, step_register);
            function->AddInstruction(instruction, line);
        }
        // Jump to the begin of the loop
        instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, line);
        AddLoopJumpInfo(num_for, index, LoopJumpInfo::JumpHead);
    }